

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  bool bVar1;
  Prim *c_prim;
  Prim *local_10;
  
  local_10 = (Prim *)0x0;
  bVar1 = find_prim_by_prim_id(this,prim_id,&local_10,err);
  if (bVar1) {
    *prim = local_10;
  }
  return bVar1;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, Prim *&prim,
                                 std::string *err) {
  const Prim *c_prim{nullptr};
  if (!find_prim_by_prim_id(prim_id, c_prim, err)) {
    return false;
  }

  // remove const
  prim = const_cast<Prim *>(c_prim);

  return true;
}